

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

RealType __thiscall OpenMD::EAM::fastPower(EAM *this,RealType x,int y)

{
  RealType RVar1;
  
  if (y == 0) {
    RVar1 = 1.0;
  }
  else {
    RVar1 = fastPower(this,x,y / 2);
    if ((y & 1U) == 0) {
      RVar1 = RVar1 * RVar1;
    }
    else if (y < 1) {
      RVar1 = (RVar1 * RVar1) / x;
    }
    else {
      RVar1 = RVar1 * x * RVar1;
    }
  }
  return RVar1;
}

Assistant:

RealType EAM::fastPower(RealType x, int y) {
    RealType temp;
    if (y == 0) return 1;
    temp = fastPower(x, y / 2);
    if (y % 2 == 0)
      return temp * temp;
    else {
      if (y > 0)
        return x * temp * temp;
      else
        return (temp * temp) / x;
    }
  }